

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# odometry.c
# Opt level: O0

int odometry_receive_loop(void)

{
  int iVar1;
  ParametersPtr p_Var2;
  Parameters *param;
  int ret;
  
  p_Var2 = get_param_ptr();
  g_interval = 0.005;
  while( true ) {
    iVar1 = serial_recieve(odometry_receive,(void *)0x0);
    if (p_Var2->parameter_applying == 0) break;
    yprintf(OUTPUT_LV_INFO,"Restarting odometry receive loop.\n");
  }
  return iVar1;
}

Assistant:

int odometry_receive_loop(void)
{
  int ret;
  Parameters* param;
  param = get_param_ptr();

  g_interval = SER_INTERVAL;
  while (1)
  {
    ret = serial_recieve(odometry_receive, NULL);
    if (param->parameter_applying)
    {
      yprintf(OUTPUT_LV_INFO, "Restarting odometry receive loop.\n");
      continue;
    }
    break;
  }

  return ret;
}